

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O0

Aig_Obj_t * Bdc_FunCopyHop(Bdc_Fun_t *pObj)

{
  int c;
  Bdc_Fun_t *p;
  Aig_Obj_t *pAVar1;
  Bdc_Fun_t *pObj_local;
  
  p = Bdc_Regular(pObj);
  pAVar1 = (Aig_Obj_t *)Bdc_FuncCopy(p);
  c = Bdc_IsComplement(pObj);
  pAVar1 = Aig_NotCond(pAVar1,c);
  return pAVar1;
}

Assistant:

static inline Aig_Obj_t * Bdc_FunCopyHop( Bdc_Fun_t * pObj )  
{ return Aig_NotCond( (Aig_Obj_t *)Bdc_FuncCopy(Bdc_Regular(pObj)), Bdc_IsComplement(pObj) );  }